

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter-template.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  uint uVar4;
  _Base_bitset<1UL> _Var5;
  char *pcVar6;
  double dVar7;
  double dVar8;
  bitset<16UL> local_28;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting");
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar7 = testKalmanFilter();
  pcVar6 = "Test Kalman filter SUCCEEDED: estimationError = ";
  if (0.1 <= dVar7) {
    pcVar6 = "Test Kalman filter FAILED: estimationError = ";
  }
  std::operator<<((ostream *)&std::cout,pcVar6);
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar8 = testKalmanFilterZeroInput();
  pcVar6 = "Test Kalman filter (zero input) FAILED: estimationError = ";
  if (dVar8 < 0.1) {
    pcVar6 = "Test Kalman filter (zero input) SUCCEEDED: estimationError = ";
  }
  uVar4 = (0.1 <= dVar7) + 2;
  if (dVar8 < 0.1) {
    uVar4 = (uint)(0.1 <= dVar7);
  }
  std::operator<<((ostream *)&std::cout,pcVar6);
  poVar2 = std::ostream::_M_insert<double>(dVar8);
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar7 = testExtendedKalmanFilter();
  pcVar6 = "Test extended Kalman filter FAILED: estimationError = ";
  if (dVar7 < 0.1) {
    pcVar6 = "Test extended Kalman filter SUCCEEDED: estimationError = ";
  }
  uVar1 = uVar4 + 4;
  if (dVar7 < 0.1) {
    uVar1 = uVar4;
  }
  std::operator<<((ostream *)&std::cout,pcVar6);
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar7 = testExtendedKalmanFilterLTV();
  pcVar6 = "Test extended Kalman filter (LTV) FAILED: estimationError = ";
  if (dVar7 < 0.1) {
    pcVar6 = "Test extended Kalman filter (LTV) SUCCEEDED: estimationError = ";
  }
  uVar4 = uVar1 + 8;
  if (dVar7 < 0.1) {
    uVar4 = uVar1;
  }
  std::operator<<((ostream *)&std::cout,pcVar6);
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar7 = testExtendedKalmanFilterZeroInput();
  if (0.1 <= dVar7) {
    uVar4 = uVar4 | 0x10;
    std::operator<<((ostream *)&std::cout,
                    "Test extended Kalman filter (zero input) FAILED: estimationError = ");
    poVar2 = std::ostream::_M_insert<double>(dVar7);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "Test extended Kalman filter (zero input) SUCCEEDED: estimationError = ");
    poVar2 = std::ostream::_M_insert<double>(dVar7);
  }
  _Var5._M_w._4_4_ = 0;
  _Var5._M_w._0_4_ = uVar4;
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Test exit code ");
  local_28.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)_Var5._M_w;
  pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,&local_28);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
  return uVar4;
}

Assistant:

int main()
{
    short exit=0;
    double error;
    std::cout<<"Starting"<<std::endl;

    if ((error=testKalmanFilter())<0.1)
    {
        std::cout<<"Test Kalman filter SUCCEEDED: estimationError = "<<error<<std::endl;
    }
    else
    {
        exit=exit | BOOST_BINARY( 1 );
        std::cout<<"Test Kalman filter FAILED: estimationError = "<<error<<std::endl;
    }
    if ((error=testKalmanFilterZeroInput())<0.1)
    {
        std::cout<<"Test Kalman filter (zero input) SUCCEEDED: estimationError = "<<error<<std::endl;
    }
    else
    {
        exit=exit | BOOST_BINARY( 10 );
        std::cout<<"Test Kalman filter (zero input) FAILED: estimationError = "<<error<<std::endl;
    }
    if ((error=testExtendedKalmanFilter())<0.1)
    {
        std::cout<<"Test extended Kalman filter SUCCEEDED: estimationError = "<<error<<std::endl;
    }
    else
    {
        exit=exit | BOOST_BINARY( 100 );
        std::cout<<"Test extended Kalman filter FAILED: estimationError = "<<error<<std::endl;
    }
    if ((error=testExtendedKalmanFilterLTV())<0.1)
    {
        std::cout<<"Test extended Kalman filter (LTV) SUCCEEDED: estimationError = "<<error<<std::endl;
    }
    else
    {
        exit=exit | BOOST_BINARY( 1000 );
        std::cout<<"Test extended Kalman filter (LTV) FAILED: estimationError = "<<error<<std::endl;
    }
    if ((error=testExtendedKalmanFilterZeroInput())<0.1)
    {
        std::cout<<"Test extended Kalman filter (zero input) SUCCEEDED: estimationError = "<<error<<std::endl;
    }
    else
    {
        exit=exit | BOOST_BINARY( 10000 );
        std::cout<<"Test extended Kalman filter (zero input) FAILED: estimationError = "<<error<<std::endl<<std::endl;
    }


    std::cout<<"Test exit code "<< std::bitset< 16 >(exit) <<std::endl;

    return exit;

}